

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn_SET_OF.c
# Opt level: O2

int asn_set_add(void *asn_set_of_x,void *ptr)

{
  int *piVar1;
  void *__ptr;
  int iVar2;
  int iVar3;
  
  if (asn_set_of_x == (void *)0x0 || ptr == (void *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
LAB_00141607:
    iVar2 = -1;
  }
  else {
    iVar2 = *(int *)((long)asn_set_of_x + 8);
    __ptr = *asn_set_of_x;
    if (iVar2 == *(int *)((long)asn_set_of_x + 0xc)) {
      iVar3 = 4;
      if (iVar2 != 0) {
        iVar3 = iVar2 * 2;
      }
      __ptr = realloc(__ptr,(long)iVar3 << 3);
      if (__ptr == (void *)0x0) goto LAB_00141607;
      *(void **)asn_set_of_x = __ptr;
      *(int *)((long)asn_set_of_x + 0xc) = iVar3;
      iVar2 = *(int *)((long)asn_set_of_x + 8);
    }
    *(int *)((long)asn_set_of_x + 8) = iVar2 + 1;
    *(void **)((long)__ptr + (long)iVar2 * 8) = ptr;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
asn_set_add(void *asn_set_of_x, void *ptr) {
	asn_anonymous_set_ *as = _A_SET_FROM_VOID(asn_set_of_x);

	if(as == 0 || ptr == 0) {
		errno = EINVAL;		/* Invalid arguments */
		return -1;
	}

	/*
	 * Make sure there's enough space to insert an element.
	 */
	if(as->count == as->size) {
		int _newsize = as->size ? (as->size << 1) : 4;
		void *_new_arr;
		_new_arr = REALLOC(as->array, _newsize * sizeof(as->array[0]));
		if(_new_arr) {
			as->array = (void **)_new_arr;
			as->size = _newsize;
		} else {
			/* ENOMEM */
			return -1;
		}
	}

	as->array[as->count++] = ptr;

	return 0;
}